

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

ostream * cts::operator<<(ostream *out,string *s)

{
  char *pcVar1;
  ostream *poVar2;
  ostream *in_RDI;
  
  pcVar1 = string::c_str((string *)0x103371);
  poVar2 = std::operator<<(in_RDI,pcVar1);
  return poVar2;
}

Assistant:

std::ostream& operator<< (std::ostream& out, string const& s)
{
	return out << s.c_str();
}